

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O0

_Bool GenerateSequence(FILE *out,int startInd,int len,char *output)

{
  int iVar1;
  int local_28;
  _Bool local_21;
  int i;
  _Bool res;
  char *output_local;
  int len_local;
  int startInd_local;
  FILE *out_local;
  
  local_21 = true;
  if (0 < len) {
    for (local_28 = 0; local_28 < 0x1a; local_28 = local_28 + 1) {
      output[startInd] = (char)local_28 + 'a';
      local_21 = GenerateSequence(out,startInd + 1,len + -1,output);
    }
  }
  if ((len == 0) && (iVar1 = fprintf((FILE *)out,"%s\n",output), iVar1 < 0)) {
    printf("can\'t create in.txt. No space on disk?\n");
    fclose((FILE *)out);
    local_21 = false;
  }
  return local_21;
}

Assistant:

static bool GenerateSequence(FILE *out, int startInd, int len, char *output) {
    bool res = true;
    if (len > 0) {
        for (int i = 0; i < ALPHABET_SIZE; i++) {
            output[startInd] = 'a' + i;
            res = GenerateSequence(out, startInd + 1, len - 1, output);
        }
    }
    if (len == 0) {
        if (fprintf(out, "%s\n", output) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(out);
            res = false;
        }
    }
    return res;
}